

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast_node::set_location_range(ast_node *this,YYLTYPE *begin,YYLTYPE *end)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  (this->location).path = begin->path;
  (this->location).source = begin->source;
  uVar3 = begin->first_column;
  uVar1 = end->last_line;
  uVar2 = end->last_column;
  (this->location).first_line = begin->first_line;
  (this->location).first_column = uVar3;
  (this->location).last_line = uVar1;
  (this->location).last_column = uVar2;
  return;
}

Assistant:

void set_location_range(const struct YYLTYPE &begin, const struct YYLTYPE &end)
   {
      this->location.path = begin.path;
      this->location.source = begin.source;
      this->location.first_line = begin.first_line;
      this->location.last_line = end.last_line;
      this->location.first_column = begin.first_column;
      this->location.last_column = end.last_column;
   }